

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

opvar * opvar_var_conversion(sp_coder *coder,opvar *ov)

{
  int iVar1;
  opvar *poVar2;
  long lVar3;
  anon_union_8_2_1f58d0b7_for_data *paVar4;
  splev_var *psVar5;
  
  if (ov != (opvar *)0x0) {
    if (ov->spovartyp != '\x03') {
      return ov;
    }
    psVar5 = (splev_var *)&coder->frame->variables;
    while (psVar5 = psVar5->next, psVar5 != (splev_var *)0x0) {
      iVar1 = strcmp(psVar5->name,(ov->vardata).str);
      if (iVar1 == 0) {
        if ((psVar5->svtyp & 0x40U) == 0) {
          paVar4 = &psVar5->data;
        }
        else {
          poVar2 = splev_stack_pop(coder->stack);
          poVar2 = opvar_var_conversion(coder,poVar2);
          if ((poVar2 == (opvar *)0x0) || (poVar2->spovartyp != '\x01')) {
            panic("array idx not an int");
          }
          if (psVar5->array_len < 1) {
            panic("array len < 1");
          }
          lVar3 = (poVar2->vardata).l % psVar5->array_len;
          (poVar2->vardata).l = lVar3;
          paVar4 = (anon_union_8_2_1f58d0b7_for_data *)
                   (&((psVar5->data).value)->spovartyp + lVar3 * 8);
        }
        poVar2 = opvar_clone(paVar4->value);
        return poVar2;
      }
    }
  }
  return (opvar *)0x0;
}

Assistant:

static struct opvar *opvar_var_conversion(struct sp_coder *coder, struct opvar *ov)
{
	struct splev_var *tmp;
	struct opvar *tmpov;
	struct opvar *array_idx = NULL;

	if (!coder || !ov) return NULL;
	if (ov->spovartyp != SPOVAR_VARIABLE) return ov;

	tmp = coder->frame->variables;
	while (tmp) {
	    if (!strcmp(tmp->name, OV_s(ov))) {
		if (tmp->svtyp & SPOVAR_ARRAY) {
		    array_idx = opvar_var_conversion(coder,
						     splev_stack_pop(coder->stack));
		    if (!array_idx || OV_typ(array_idx) != SPOVAR_INT)
			panic("array idx not an int");
		    if (tmp->array_len < 1)
			panic("array len < 1");
		    OV_i(array_idx) = (OV_i(array_idx) % tmp->array_len);
		    tmpov = opvar_clone(tmp->data.arrayvalues[OV_i(array_idx)]);
		    return tmpov;
		} else {
		    tmpov = opvar_clone(tmp->data.value);
		    return tmpov;
		}
	    }
	    tmp = tmp->next;
	}

	return NULL;
}